

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

void __thiscall Assimp::FIUUIDValueImpl::~FIUUIDValueImpl(FIUUIDValueImpl *this)

{
  FIUUIDValueImpl *this_local;
  
  (this->super_FIUUIDValue).super_FIByteValue.super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__00fb14e8;
  std::__cxx11::string::~string((string *)&this->strValue);
  FIUUIDValue::~FIUUIDValue(&this->super_FIUUIDValue);
  return;
}

Assistant:

inline FIUUIDValueImpl(std::vector<uint8_t> &&value_): strValueValid(false) { value = std::move(value_); }